

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# express_node.cpp
# Opt level: O0

void __thiscall front::express::ExpressNode::ExpressNode(ExpressNode *this)

{
  undefined4 *in_RDI;
  
  std::__cxx11::string::string((string *)(in_RDI + 4));
  std::
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ::vector((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
            *)0x253524);
  *in_RDI = 0;
  in_RDI[1] = 0xd;
  in_RDI[2] = 0;
  std::__cxx11::string::operator=((string *)(in_RDI + 4),"");
  return;
}

Assistant:

ExpressNode::ExpressNode() {
  _type = NodeType::CNS;
  _operation = OperationType::AND;
  _value = 0;
  _name = "";
}